

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::fastPresolveLoop(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  Result RVar1;
  double dVar2;
  
  while( true ) {
    storeCurrentProblemSize(this);
    RVar1 = removeRowSingletons(this,postsolve_stack);
    if (RVar1 != kOk) {
      return RVar1;
    }
    RVar1 = presolveChangedRows(this,postsolve_stack);
    if (RVar1 != kOk) {
      return RVar1;
    }
    RVar1 = removeDoubletonEquations(this,postsolve_stack);
    if (RVar1 != kOk) {
      return RVar1;
    }
    RVar1 = presolveColSingletons(this,postsolve_stack);
    if (RVar1 != kOk) break;
    RVar1 = presolveChangedCols(this,postsolve_stack);
    if (RVar1 != kOk) {
      return RVar1;
    }
    dVar2 = problemSizeReduction(this);
    if (dVar2 <= 0.01) {
      return kOk;
    }
  }
  return RVar1;
}

Assistant:

HPresolve::Result HPresolve::fastPresolveLoop(
    HighsPostsolveStack& postsolve_stack) {
  do {
    storeCurrentProblemSize();

    HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveChangedRows(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(removeDoubletonEquations(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveColSingletons(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveChangedCols(postsolve_stack));

  } while (problemSizeReduction() > 0.01);

  return Result::kOk;
}